

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  pointer pSVar2;
  size_t sVar3;
  ostream *poVar4;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar2 -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar2 = pSVar2 + 1, pSVar2 != pSVar1) {
      printHeaderString(this,&pSVar2->name,2);
    }
    Colour::use(None);
    pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  local_28.file = pSVar2[-1].lineInfo.file;
  local_28.line = pSVar2[-1].lineInfo.line;
  poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000294810 = 0x2d2d2d2d2d2d2d;
    uRam0000000000294817._0_1_ = '-';
    uRam0000000000294817._1_1_ = '-';
    uRam0000000000294817._2_1_ = '-';
    uRam0000000000294817._3_1_ = '-';
    uRam0000000000294817._4_1_ = '-';
    uRam0000000000294817._5_1_ = '-';
    uRam0000000000294817._6_1_ = '-';
    uRam0000000000294817._7_1_ = '-';
    DAT_00294800 = '-';
    DAT_00294800_1._0_1_ = '-';
    DAT_00294800_1._1_1_ = '-';
    DAT_00294800_1._2_1_ = '-';
    DAT_00294800_1._3_1_ = '-';
    DAT_00294800_1._4_1_ = '-';
    DAT_00294800_1._5_1_ = '-';
    DAT_00294800_1._6_1_ = '-';
    uRam0000000000294808 = 0x2d2d2d2d2d2d2d;
    DAT_0029480f = 0x2d;
    DAT_002947f0 = '-';
    DAT_002947f0_1._0_1_ = '-';
    DAT_002947f0_1._1_1_ = '-';
    DAT_002947f0_1._2_1_ = '-';
    DAT_002947f0_1._3_1_ = '-';
    DAT_002947f0_1._4_1_ = '-';
    DAT_002947f0_1._5_1_ = '-';
    DAT_002947f0_1._6_1_ = '-';
    uRam00000000002947f8._0_1_ = '-';
    uRam00000000002947f8._1_1_ = '-';
    uRam00000000002947f8._2_1_ = '-';
    uRam00000000002947f8._3_1_ = '-';
    uRam00000000002947f8._4_1_ = '-';
    uRam00000000002947f8._5_1_ = '-';
    uRam00000000002947f8._6_1_ = '-';
    uRam00000000002947f8._7_1_ = '-';
    DAT_002947e0 = '-';
    DAT_002947e0_1._0_1_ = '-';
    DAT_002947e0_1._1_1_ = '-';
    DAT_002947e0_1._2_1_ = '-';
    DAT_002947e0_1._3_1_ = '-';
    DAT_002947e0_1._4_1_ = '-';
    DAT_002947e0_1._5_1_ = '-';
    DAT_002947e0_1._6_1_ = '-';
    uRam00000000002947e8._0_1_ = '-';
    uRam00000000002947e8._1_1_ = '-';
    uRam00000000002947e8._2_1_ = '-';
    uRam00000000002947e8._3_1_ = '-';
    uRam00000000002947e8._4_1_ = '-';
    uRam00000000002947e8._5_1_ = '-';
    uRam00000000002947e8._6_1_ = '-';
    uRam00000000002947e8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000002947d8._0_1_ = '-';
    uRam00000000002947d8._1_1_ = '-';
    uRam00000000002947d8._2_1_ = '-';
    uRam00000000002947d8._3_1_ = '-';
    uRam00000000002947d8._4_1_ = '-';
    uRam00000000002947d8._5_1_ = '-';
    uRam00000000002947d8._6_1_ = '-';
    uRam00000000002947d8._7_1_ = '-';
    DAT_0029481f = 0;
  }
  sVar3 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&getLineOfChars<(char)45>()::line,sVar3)
  ;
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
  local_2a[1] = 0;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(os,&local_28);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
  poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000002948b0 = 0x2e2e2e2e2e2e2e;
    uRam00000000002948b7._0_1_ = '.';
    uRam00000000002948b7._1_1_ = '.';
    uRam00000000002948b7._2_1_ = '.';
    uRam00000000002948b7._3_1_ = '.';
    uRam00000000002948b7._4_1_ = '.';
    uRam00000000002948b7._5_1_ = '.';
    uRam00000000002948b7._6_1_ = '.';
    uRam00000000002948b7._7_1_ = '.';
    DAT_002948a0 = '.';
    DAT_002948a0_1._0_1_ = '.';
    DAT_002948a0_1._1_1_ = '.';
    DAT_002948a0_1._2_1_ = '.';
    DAT_002948a0_1._3_1_ = '.';
    DAT_002948a0_1._4_1_ = '.';
    DAT_002948a0_1._5_1_ = '.';
    DAT_002948a0_1._6_1_ = '.';
    uRam00000000002948a8 = 0x2e2e2e2e2e2e2e;
    DAT_002948af = 0x2e;
    DAT_00294890 = '.';
    DAT_00294890_1._0_1_ = '.';
    DAT_00294890_1._1_1_ = '.';
    DAT_00294890_1._2_1_ = '.';
    DAT_00294890_1._3_1_ = '.';
    DAT_00294890_1._4_1_ = '.';
    DAT_00294890_1._5_1_ = '.';
    DAT_00294890_1._6_1_ = '.';
    uRam0000000000294898._0_1_ = '.';
    uRam0000000000294898._1_1_ = '.';
    uRam0000000000294898._2_1_ = '.';
    uRam0000000000294898._3_1_ = '.';
    uRam0000000000294898._4_1_ = '.';
    uRam0000000000294898._5_1_ = '.';
    uRam0000000000294898._6_1_ = '.';
    uRam0000000000294898._7_1_ = '.';
    DAT_00294880 = '.';
    DAT_00294880_1._0_1_ = '.';
    DAT_00294880_1._1_1_ = '.';
    DAT_00294880_1._2_1_ = '.';
    DAT_00294880_1._3_1_ = '.';
    DAT_00294880_1._4_1_ = '.';
    DAT_00294880_1._5_1_ = '.';
    DAT_00294880_1._6_1_ = '.';
    uRam0000000000294888._0_1_ = '.';
    uRam0000000000294888._1_1_ = '.';
    uRam0000000000294888._2_1_ = '.';
    uRam0000000000294888._3_1_ = '.';
    uRam0000000000294888._4_1_ = '.';
    uRam0000000000294888._5_1_ = '.';
    uRam0000000000294888._6_1_ = '.';
    uRam0000000000294888._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000294878._0_1_ = '.';
    uRam0000000000294878._1_1_ = '.';
    uRam0000000000294878._2_1_ = '.';
    uRam0000000000294878._3_1_ = '.';
    uRam0000000000294878._4_1_ = '.';
    uRam0000000000294878._5_1_ = '.';
    uRam0000000000294878._6_1_ = '.';
    uRam0000000000294878._7_1_ = '.';
    DAT_002948bf = 0;
  }
  sVar3 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&getLineOfChars<(char)46>()::line,sVar3)
  ;
  local_2a[0] = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}